

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> * __thiscall
libtorrent::aux::session_impl::get_settings
          (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
           *__return_storage_ptr__,session_impl *this)

{
  bool val;
  int val_00;
  string *psVar1;
  int i;
  int iVar2;
  session_settings *this_00;
  string local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_set_str_004ce1b0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__[1].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__[3].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__[2].
  super__Vector_base<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_settings;
  for (iVar2 = 0; iVar2 != 0xd; iVar2 = iVar2 + 1) {
    psVar1 = session_settings::get_str_abi_cxx11_(this_00,iVar2);
    ::std::__cxx11::string::string((string *)&local_40,(string *)psVar1);
    settings_pack::set_str((settings_pack *)__return_storage_ptr__,iVar2,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  for (iVar2 = 0x4000; iVar2 != 0x409f; iVar2 = iVar2 + 1) {
    val_00 = session_settings::get_int(this_00,iVar2);
    settings_pack::set_int((settings_pack *)__return_storage_ptr__,iVar2,val_00);
  }
  for (iVar2 = 0x8000; iVar2 != 0x8054; iVar2 = iVar2 + 1) {
    val = session_settings::get_bool(this_00,iVar2);
    settings_pack::set_bool((settings_pack *)__return_storage_ptr__,iVar2,val);
  }
  return __return_storage_ptr__;
}

Assistant:

settings_pack session_impl::get_settings() const
	{
		settings_pack ret;
		// TODO: it would be nice to reserve() these vectors up front
		for (int i = settings_pack::string_type_base;
			i < settings_pack::max_string_setting_internal; ++i)
		{
			ret.set_str(i, m_settings.get_str(i));
		}
		for (int i = settings_pack::int_type_base;
			i < settings_pack::max_int_setting_internal; ++i)
		{
			ret.set_int(i, m_settings.get_int(i));
		}
		for (int i = settings_pack::bool_type_base;
			i < settings_pack::max_bool_setting_internal; ++i)
		{
			ret.set_bool(i, m_settings.get_bool(i));
		}
		return ret;
	}